

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

int __thiscall
CConsole::PossibleCommands
          (CConsole *this,char *pStr,int FlagMask,bool Temp,FPossibleCallback pfnCallback,
          void *pUser)

{
  char *pcVar1;
  int Index;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    this = (CConsole *)this->m_pFirstCommand;
    if (this == (CConsole *)0x0) break;
    if (((*(uint *)&this->m_pFirstExec & FlagMask) != 0) &&
       (*(bool *)((long)&this->m_pFirstExec + 4) == Temp)) {
      pcVar1 = str_find_nocase(*(char **)&this->m_FlagMask,pStr);
      if (pcVar1 != (char *)0x0) {
        (*pfnCallback)(iVar2,*(char **)&this->m_FlagMask,pUser);
        iVar2 = iVar2 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int CConsole::PossibleCommands(const char *pStr, int FlagMask, bool Temp, FPossibleCallback pfnCallback, void *pUser)
{
	int Index = 0;
	for(CCommand *pCommand = m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&FlagMask && pCommand->m_Temp == Temp && str_find_nocase(pCommand->m_pName, pStr))
		{
			pfnCallback(Index, pCommand->m_pName, pUser);
			Index++;
		}
	}
	return Index;
}